

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-split.cpp
# Opt level: O3

void anon_unknown.dwarf_3e7fa::writeSymbolMap(Module *wasm,string *filename)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  undefined8 uVar1;
  pointer pcVar2;
  long lVar3;
  undefined8 *puVar4;
  PassOptions *pPVar5;
  PassRunner local_2e0 [8];
  PassRunner runner;
  PassOptions local_1f0;
  undefined1 local_138 [12];
  undefined8 uStack_12c;
  undefined4 local_124;
  undefined1 local_120;
  undefined5 local_11c;
  undefined3 uStack_117;
  undefined5 uStack_114;
  undefined1 local_100;
  undefined1 local_f8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_f0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_b8;
  long *local_80 [2];
  long local_70 [2];
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
  local_60;
  __alloc_node_gen_t __alloc_node_gen;
  long local_48 [2];
  char local_38;
  
  local_138._0_2_ = 0x100;
  local_138[2] = 1;
  local_138._4_8_ = 0;
  uStack_12c = 0xffffffff00000002;
  local_124 = 0x14;
  local_120 = 0;
  local_100 = 0;
  local_f8 = 0;
  local_11c = 0;
  uStack_117 = 0;
  uStack_114 = 0;
  local_f0._M_buckets = &local_f0._M_single_bucket;
  local_f0._M_bucket_count = 1;
  local_f0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_f0._M_element_count = 0;
  local_f0._M_rehash_policy._M_max_load_factor = 1.0;
  local_f0._M_rehash_policy._M_next_resize = 0;
  local_f0._M_single_bucket = (__node_base_ptr)0x0;
  local_b8._M_buckets = &local_b8._M_single_bucket;
  local_b8._M_bucket_count = 1;
  local_b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b8._M_element_count = 0;
  local_b8._M_rehash_policy._M_max_load_factor = 1.0;
  local_b8._M_rehash_policy._M_next_resize = 0;
  local_b8._M_single_bucket = (__node_base_ptr)0x0;
  puVar4 = (undefined8 *)local_138;
  pPVar5 = &local_1f0;
  for (lVar3 = 8; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar1 = *puVar4;
    pPVar5->debug = (bool)(char)uVar1;
    pPVar5->validate = (bool)(char)((ulong)uVar1 >> 8);
    pPVar5->validateGlobally = (bool)(char)((ulong)uVar1 >> 0x10);
    pPVar5->field_0x3 = (char)((ulong)uVar1 >> 0x18);
    pPVar5->optimizeLevel = (int)((ulong)uVar1 >> 0x20);
    puVar4 = puVar4 + 1;
    pPVar5 = (PassOptions *)&pPVar5->shrinkLevel;
  }
  local_1f0.targetJS = false;
  this = &local_1f0.arguments;
  local_1f0.arguments._M_h._M_buckets = (__buckets_ptr)0x0;
  local_1f0.arguments._M_h._M_bucket_count = 1;
  local_1f0.arguments._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1f0.arguments._M_h._M_element_count = 0;
  local_1f0.arguments._M_h._M_rehash_policy._4_4_ = local_f0._M_rehash_policy._4_4_;
  local_1f0.arguments._M_h._M_rehash_policy._M_max_load_factor =
       local_f0._M_rehash_policy._M_max_load_factor;
  local_1f0.arguments._M_h._M_rehash_policy._M_next_resize =
       local_f0._M_rehash_policy._M_next_resize;
  local_1f0.arguments._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_60._M_h = (__hashtable_alloc *)this;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)this,&local_f0,&local_60);
  this_00 = &local_1f0.passesToSkip;
  local_1f0.passesToSkip._M_h._M_buckets = (__buckets_ptr)0x0;
  local_1f0.passesToSkip._M_h._M_bucket_count = local_b8._M_bucket_count;
  local_1f0.passesToSkip._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1f0.passesToSkip._M_h._M_element_count = local_b8._M_element_count;
  local_1f0.passesToSkip._M_h._M_rehash_policy._4_4_ = local_b8._M_rehash_policy._4_4_;
  local_1f0.passesToSkip._M_h._M_rehash_policy._M_max_load_factor =
       local_b8._M_rehash_policy._M_max_load_factor;
  local_1f0.passesToSkip._M_h._M_rehash_policy._M_next_resize =
       local_b8._M_rehash_policy._M_next_resize;
  local_1f0.passesToSkip._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_60._M_h = (__hashtable_alloc *)this_00;
  std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)this_00,&local_b8,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
              *)&local_60);
  ::wasm::PassRunner::PassRunner(local_2e0,wasm,&local_1f0);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&this_00->_M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&this->_M_h);
  local_80[0] = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"symbolmap","");
  pcVar2 = (filename->_M_dataplus)._M_p;
  __alloc_node_gen._M_h = (__hashtable_alloc *)local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__alloc_node_gen,pcVar2,pcVar2 + filename->_M_string_length);
  local_38 = '\x01';
  ::wasm::PassRunner::add(local_2e0,local_80);
  if (local_38 == '\x01') {
    local_38 = '\0';
    if (__alloc_node_gen._M_h != (__hashtable_alloc *)local_48) {
      operator_delete(__alloc_node_gen._M_h,local_48[0] + 1);
    }
  }
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] + 1);
  }
  ::wasm::PassRunner::run();
  ::wasm::PassRunner::~PassRunner(local_2e0);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_b8);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_f0);
  return;
}

Assistant:

void writeSymbolMap(Module& wasm, std::string filename) {
  PassOptions options;
  PassRunner runner(&wasm, options);
  runner.add("symbolmap", filename);
  runner.run();
}